

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void cmGlobalNinjaGenerator::WriteDefault(ostream *os,cmNinjaDeps *targets,string *comment)

{
  ostream *poVar1;
  pointer pbVar2;
  
  WriteComment(os,comment);
  std::operator<<(os,"default");
  for (pbVar2 = (targets->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (targets->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    poVar1 = std::operator<<(os," ");
    std::operator<<(poVar1,(string *)pbVar2);
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteDefault(std::ostream& os,
                                          const cmNinjaDeps& targets,
                                          const std::string& comment)
{
  cmGlobalNinjaGenerator::WriteComment(os, comment);
  os << "default";
  for(cmNinjaDeps::const_iterator i = targets.begin(); i != targets.end(); ++i)
    os << " " << *i;
  os << "\n";
}